

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ValidateEnum(Parser *this,EnumDescriptorProto *proto)

{
  _Base_ptr p_Var1;
  char cVar2;
  int iVar3;
  _Rb_tree_color _Var4;
  Rep *pRVar5;
  ErrorCollector *pEVar6;
  _Base_ptr p_Var7;
  int iVar8;
  Type *from;
  LogMessage *pLVar9;
  void *pvVar10;
  Type *pTVar11;
  long *plVar12;
  long lVar13;
  undefined8 *puVar14;
  size_type *psVar15;
  _Base_ptr *pp_Var16;
  _Base_ptr p_Var17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  void **ppvVar18;
  int iVar19;
  size_type sVar20;
  undefined1 *puVar21;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  void **ppvVar24;
  bool bVar25;
  string error;
  set<int,_std::less<int>,_std::allocator<int>_> used_values;
  undefined1 local_e8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [12];
  uint uStack_84;
  _Base_ptr local_80;
  _Base_ptr p_Stack_78;
  _Base_ptr local_70;
  Rep *local_68;
  ArenaStringPtr local_60;
  
  puVar21 = (undefined1 *)proto->options_;
  if ((EnumOptions *)puVar21 == (EnumOptions *)0x0) {
    puVar21 = _EnumOptions_default_instance_;
  }
  iVar19 = 0;
  if (0 < (((EnumOptions *)puVar21)->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_
     ) {
    do {
      from = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                       (&(((EnumOptions *)puVar21)->uninterpreted_option_).
                         super_RepeatedPtrFieldBase,iVar19);
      UninterpretedOption::UninterpretedOption((UninterpretedOption *)local_90,from);
      if ((int)local_70 < 2) {
        if ((int)local_70 != 1) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          pLVar9 = internal::LogMessage::operator<<
                             ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar9);
          internal::LogMessage::~LogMessage((LogMessage *)local_e8);
        }
        pvVar10 = local_68->elements[0];
        if (*(char *)((long)pvVar10 + 0x20) == '\0') {
          if ((int)local_70 < 1) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                       ,0x358);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_e8,"CHECK failed: (index) < (current_size_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_e8);
            pvVar10 = local_68->elements[0];
          }
          iVar8 = std::__cxx11::string::compare
                            ((char *)(*(ulong *)((long)pvVar10 + 0x18) & 0xfffffffffffffffe));
          if (iVar8 == 0) {
            iVar19 = std::__cxx11::string::compare
                               ((char *)((ulong)local_60.tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            UninterpretedOption::~UninterpretedOption((UninterpretedOption *)local_90);
            if (iVar19 != 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e8,"\"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
              plVar12 = (long *)std::__cxx11::string::append((char *)local_e8);
              pp_Var16 = (_Base_ptr *)(plVar12 + 2);
              if ((_Base_ptr *)*plVar12 == pp_Var16) {
                local_80 = *pp_Var16;
                p_Stack_78 = (_Base_ptr)plVar12[3];
                local_90._0_8_ = &local_80;
              }
              else {
                local_80 = *pp_Var16;
                local_90._0_8_ = (_Base_ptr *)*plVar12;
              }
              unique0x00012000 = plVar12[1];
              *plVar12 = (long)pp_Var16;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
                operator_delete((void *)local_e8._0_8_);
              }
              pEVar6 = this->error_collector_;
              if (pEVar6 != (ErrorCollector *)0x0) {
                (*pEVar6->_vptr_ErrorCollector[2])
                          (pEVar6,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,local_90);
              }
              this->had_errors_ = true;
              if ((_Base_ptr *)local_90._0_8_ != &local_80) {
                operator_delete((void *)local_90._0_8_);
              }
              return false;
            }
            iVar19 = 1;
            goto LAB_0033a43f;
          }
        }
      }
      UninterpretedOption::~UninterpretedOption((UninterpretedOption *)local_90);
      puVar21 = (undefined1 *)proto->options_;
      if ((EnumOptions *)puVar21 == (EnumOptions *)0x0) {
        puVar21 = _EnumOptions_default_instance_;
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < (((EnumOptions *)puVar21)->uninterpreted_option_).super_RepeatedPtrFieldBase.
                      current_size_);
    iVar19 = 0;
  }
LAB_0033a43f:
  p_Var1 = (_Base_ptr)(local_90 + 8);
  stack0xffffffffffffff78 = (ulong)uStack_84 << 0x20;
  iVar8 = 0;
  local_80 = (_Base_ptr)0x0;
  local_68 = (Rep *)0x0;
  p_Stack_78 = p_Var1;
  local_70 = p_Var1;
  if (0 < (proto->value_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                          (&(proto->value_).super_RepeatedPtrFieldBase,iVar8);
      iVar3 = pTVar11->number_;
      p_Var7 = local_80;
      p_Var23 = p_Var1;
      if (local_80 != (_Base_ptr)0x0) {
        do {
          p_Var22 = p_Var23;
          p_Var17 = p_Var7;
          _Var4 = p_Var17[1]._M_color;
          p_Var23 = p_Var17;
          if ((int)_Var4 < iVar3) {
            p_Var23 = p_Var22;
          }
          p_Var7 = (&p_Var17->_M_left)[(int)_Var4 < iVar3];
        } while ((&p_Var17->_M_left)[(int)_Var4 < iVar3] != (_Base_ptr)0x0);
        if (p_Var23 != p_Var1) {
          if ((int)_Var4 < iVar3) {
            p_Var17 = p_Var22;
          }
          if ((int)p_Var17[1]._M_color <= iVar3) {
            bVar25 = true;
            if ((char)iVar19 == '\0') goto LAB_0033a545;
            goto LAB_0033a6de;
          }
        }
      }
      local_e8._0_4_ = iVar3;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_90,(int *)local_e8);
      iVar8 = iVar8 + 1;
    } while (iVar8 < (proto->value_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((char)iVar19 == '\0') {
LAB_0033a545:
    pRVar5 = (proto->value_).super_RepeatedPtrFieldBase.rep_;
    ppvVar24 = pRVar5->elements;
    if (pRVar5 == (Rep *)0x0) {
      ppvVar24 = (void **)0x0;
    }
    lVar13 = (long)(proto->value_).super_RepeatedPtrFieldBase.current_size_;
    bVar25 = true;
    if (lVar13 != 0) {
      ppvVar18 = ppvVar24 + lVar13;
      do {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(ulong *)((long)*ppvVar24 + 0x18) & 0xfffffffffffffffe);
        if (__rhs->_M_string_length != 0) {
          sVar20 = 0;
          do {
            cVar2 = (__rhs->_M_dataplus)._M_p[sVar20];
            if (((9 < (byte)(cVar2 - 0x30U)) && (cVar2 != '_')) && (0x19 < (byte)(cVar2 + 0xbfU))) {
              std::operator+(&local_b0,"Enum constant should be in UPPER_CASE. Found: ",__rhs);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
              psVar15 = puVar14 + 2;
              if ((size_type *)*puVar14 == psVar15) {
                local_e8._16_8_ = *psVar15;
                local_e8._24_8_ = puVar14[3];
                local_e8._0_8_ = local_e8 + 0x10;
              }
              else {
                local_e8._16_8_ = *psVar15;
                local_e8._0_8_ = (size_type *)*puVar14;
              }
              local_e8._8_8_ = puVar14[1];
              *puVar14 = psVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              pEVar6 = this->error_collector_;
              if (pEVar6 != (ErrorCollector *)0x0) {
                (*pEVar6->_vptr_ErrorCollector[3])
                          (pEVar6,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,local_e8);
              }
              if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
                operator_delete((void *)local_e8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
              break;
            }
            sVar20 = sVar20 + 1;
          } while (__rhs->_M_string_length != sVar20);
        }
        ppvVar24 = ppvVar24 + 1;
      } while (ppvVar24 != ppvVar18);
    }
  }
  else {
    std::operator+(&local_b0,"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar15 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar15) {
      local_e8._16_8_ = *psVar15;
      local_e8._24_8_ = plVar12[3];
      local_e8._0_8_ = local_e8 + 0x10;
    }
    else {
      local_e8._16_8_ = *psVar15;
      local_e8._0_8_ = (size_type *)*plVar12;
    }
    local_e8._8_8_ = plVar12[1];
    *plVar12 = (long)psVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pEVar6 = this->error_collector_;
    if (pEVar6 != (ErrorCollector *)0x0) {
      (*pEVar6->_vptr_ErrorCollector[2])
                (pEVar6,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,local_e8);
    }
    this->had_errors_ = true;
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_);
    }
    bVar25 = false;
  }
LAB_0033a6de:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_90);
  return bVar25;
}

Assistant:

bool Parser::ValidateEnum(const EnumDescriptorProto* proto) {
  bool has_allow_alias = false;
  bool allow_alias = false;

  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption option = proto->options().uninterpreted_option(i);
    if (option.name_size() > 1) {
      continue;
    }
    if (!option.name(0).is_extension() &&
        option.name(0).name_part() == "allow_alias") {
      has_allow_alias = true;
      if (option.identifier_value() == "true") {
        allow_alias = true;
      }
      break;
    }
  }

  if (has_allow_alias && !allow_alias) {
    std::string error =
        "\"" + proto->name() +
        "\" declares 'option allow_alias = false;' which has no effect. "
        "Please remove the declaration.";
    // This needlessly clutters declarations with nops.
    AddError(error);
    return false;
  }

  std::set<int> used_values;
  bool has_duplicates = false;
  for (int i = 0; i < proto->value_size(); ++i) {
    const EnumValueDescriptorProto& enum_value = proto->value(i);
    if (used_values.find(enum_value.number()) != used_values.end()) {
      has_duplicates = true;
      break;
    } else {
      used_values.insert(enum_value.number());
    }
  }
  if (allow_alias && !has_duplicates) {
    std::string error =
        "\"" + proto->name() +
        "\" declares support for enum aliases but no enum values share field "
        "numbers. Please remove the unnecessary 'option allow_alias = true;' "
        "declaration.";
    // Generate an error if an enum declares support for duplicate enum values
    // and does not use it protect future authors.
    AddError(error);
    return false;
  }

  // Enforce that enum constants must be UPPER_CASE except in case of
  // enum_alias.
  if (!allow_alias) {
    for (const auto& enum_value : proto->value()) {
      if (!IsUpperUnderscore(enum_value.name())) {
        AddWarning(
            "Enum constant should be in UPPER_CASE. Found: " +
            enum_value.name() +
            ". See https://developers.google.com/protocol-buffers/docs/style");
      }
    }
  }

  return true;
}